

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O3

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::ComputeNeighbouringTriangleMap
          (ChTriangleMeshConnected *this,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *tri_map)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer paVar4;
  int iVar5;
  int iVar6;
  pointer pCVar7;
  size_type sVar8;
  _Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_> _Var9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  size_type __new_size;
  long lVar13;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_std::pair<int,_int>,_int>_>_>
  pVar14;
  pair<int,_int> medgeA;
  pair<int,_int> medgeC;
  pair<int,_int> medgeB;
  multimap<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  edge_map;
  pair<const_std::pair<int,_int>,_int> local_90;
  undefined4 local_84;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *local_80;
  key_type local_78;
  key_type local_70;
  ChTriangleMeshConnected *local_68;
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar7 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_80 = tri_map;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pCVar7) {
    __new_size = 0;
  }
  else {
    lVar13 = 8;
    uVar12 = 0;
    local_68 = this;
    do {
      iVar1 = *(int *)((long)pCVar7->m_data + lVar13 + -8);
      iVar2 = *(int *)((long)pCVar7->m_data + lVar13 + -4);
      iVar3 = *(int *)((long)pCVar7->m_data + lVar13);
      iVar5 = iVar2;
      if (iVar1 < iVar2) {
        iVar5 = iVar1;
      }
      iVar11 = iVar2;
      if (iVar2 < iVar1) {
        iVar11 = iVar1;
      }
      iVar6 = iVar1;
      if (iVar3 < iVar1) {
        iVar6 = iVar3;
      }
      if (iVar1 < iVar3) {
        iVar1 = iVar3;
      }
      local_90.first.second = iVar11;
      local_90.first.first = iVar5;
      iVar11 = (int)uVar12;
      local_90.second = iVar11;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_60,&local_90);
      iVar5 = iVar3;
      if (iVar3 < iVar2) {
        iVar5 = iVar2;
      }
      if (iVar2 < iVar3) {
        iVar3 = iVar2;
      }
      local_90.first.second = iVar5;
      local_90.first.first = iVar3;
      local_90.second = iVar11;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_60,&local_90);
      local_90.first.second = iVar1;
      local_90.first.first = iVar6;
      local_90.second = iVar11;
      std::
      _Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
      ::_M_insert_equal<std::pair<std::pair<int,int>const,int>>
                ((_Rb_tree<std::pair<int,int>,std::pair<std::pair<int,int>const,int>,std::_Select1st<std::pair<std::pair<int,int>const,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,int>>>
                  *)&local_60,&local_90);
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 0xc;
      pCVar7 = (local_68->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      __new_size = ((long)(local_68->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 2) *
                   -0x5555555555555555;
      this = local_68;
    } while (uVar12 <= __new_size && __new_size - uVar12 != 0);
  }
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::resize
            (local_80,__new_size);
  pCVar7 = (this->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pCVar7) {
    local_84 = 0;
  }
  else {
    uVar12 = 0;
    local_84 = 0;
    do {
      paVar4 = (local_80->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      paVar4[uVar12]._M_elems[0] = (int)uVar12;
      paVar4[uVar12]._M_elems[1] = -1;
      paVar4[uVar12]._M_elems[2] = -1;
      paVar4[uVar12]._M_elems[3] = -1;
      local_90.first.first = pCVar7[uVar12].m_data[0];
      iVar1 = pCVar7[uVar12].m_data[1];
      local_90.first.second = iVar1;
      iVar2 = pCVar7[uVar12].m_data[2];
      local_78.second = pCVar7[uVar12].m_data[0];
      if (iVar1 < local_90.first.first) {
        local_90.first.second = local_90.first.first;
        local_90.first.first = iVar1;
      }
      local_70.first = iVar1;
      local_70.second = iVar2;
      if (iVar2 < iVar1) {
        local_70.first = iVar2;
        local_70.second = iVar1;
      }
      local_78.first = iVar2;
      if (local_78.second < iVar2) {
        local_78.first = local_78.second;
        local_78.second = iVar2;
      }
      sVar8 = std::
              _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
              ::count(&local_60,&local_90.first);
      if (((2 < sVar8) ||
          (sVar8 = std::
                   _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                   ::count(&local_60,&local_70), 2 < sVar8)) ||
         (sVar8 = std::
                  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                  ::count(&local_60,&local_78), 2 < sVar8)) {
        local_84 = (undefined4)CONCAT71((int7)(sVar8 >> 8),1);
      }
      pVar14 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_60,&local_90.first);
      for (_Var9 = pVar14.first._M_node; _Var9._M_node != pVar14.second._M_node._M_node;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node)) {
        if (uVar12 != *(uint *)&_Var9._M_node[1]._M_parent) {
          (local_80->
          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12]._M_elems[1] =
               *(uint *)&_Var9._M_node[1]._M_parent;
          break;
        }
      }
      pVar14 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_60,&local_70);
      for (_Var9 = pVar14.first._M_node; _Var9._M_node != pVar14.second._M_node._M_node;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node)) {
        if (uVar12 != *(uint *)&_Var9._M_node[1]._M_parent) {
          (local_80->
          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12]._M_elems[2] =
               *(uint *)&_Var9._M_node[1]._M_parent;
          break;
        }
      }
      pVar14 = std::
               _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::equal_range(&local_60,&local_78);
      for (_Var9 = pVar14.first._M_node; _Var9._M_node != pVar14.second._M_node._M_node;
          _Var9._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var9._M_node)) {
        if (uVar12 != *(uint *)&_Var9._M_node[1]._M_parent) {
          (local_80->
          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12]._M_elems[3] =
               *(uint *)&_Var9._M_node[1]._M_parent;
          break;
        }
      }
      pCVar7 = (this->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar12 = uVar12 + 1;
      uVar10 = ((long)(this->m_face_v_indices).
                      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 2) *
               -0x5555555555555555;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
  }
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
  ::~_Rb_tree(&local_60);
  return (bool)((byte)local_84 & 1);
}

Assistant:

bool ChTriangleMeshConnected::ComputeNeighbouringTriangleMap(std::vector<std::array<int, 4>>& tri_map) const {
    bool pathological_edges = false;

    std::multimap<std::pair<int, int>, int> edge_map;

    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        edge_map.insert({medgeA, it});
        edge_map.insert({medgeB, it});
        edge_map.insert({medgeC, it});
    }

    // Create a map of neighboring triangles, vector of:
    // [Ti TieA TieB TieC]
    tri_map.resize(this->m_face_v_indices.size());
    for (int it = 0; it < this->m_face_v_indices.size(); ++it) {
        tri_map[it][0] = it;
        tri_map[it][1] = -1;  // default no neighbour
        tri_map[it][2] = -1;  // default no neighbour
        tri_map[it][3] = -1;  // default no neighbour
        // edges = pairs of vertexes indexes
        std::pair<int, int> medgeA(this->m_face_v_indices[it].x(), this->m_face_v_indices[it].y());
        std::pair<int, int> medgeB(this->m_face_v_indices[it].y(), this->m_face_v_indices[it].z());
        std::pair<int, int> medgeC(this->m_face_v_indices[it].z(), this->m_face_v_indices[it].x());
        // vertex indexes in edges: always in increasing order to avoid ambiguous duplicated edges
        if (medgeA.first > medgeA.second)
            medgeA = std::pair<int, int>(medgeA.second, medgeA.first);
        if (medgeB.first > medgeB.second)
            medgeB = std::pair<int, int>(medgeB.second, medgeB.first);
        if (medgeC.first > medgeC.second)
            medgeC = std::pair<int, int>(medgeC.second, medgeC.first);
        if (edge_map.count(medgeA) > 2 || edge_map.count(medgeB) > 2 || edge_map.count(medgeC) > 2) {
            pathological_edges = true;
            // GetLog() << "Warning, edge shared with more than two triangles! \n";
        }
        auto retA = edge_map.equal_range(medgeA);
        for (auto fedge = retA.first; fedge != retA.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][1] = fedge->second;
                break;
            }
        }
        auto retB = edge_map.equal_range(medgeB);
        for (auto fedge = retB.first; fedge != retB.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][2] = fedge->second;
                break;
            }
        }
        auto retC = edge_map.equal_range(medgeC);
        for (auto fedge = retC.first; fedge != retC.second; ++fedge) {
            if (fedge->second != it) {
                tri_map[it][3] = fedge->second;
                break;
            }
        }
    }
    return pathological_edges;
}